

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O1

json_string *
JSONWorker::RemoveWhiteSpaceAndComments
          (json_string *__return_storage_ptr__,json_string *value_t,bool escapeQuotes)

{
  char *__ptr;
  json_auto<char> s;
  size_t len;
  size_t local_18;
  
  __ptr = private_RemoveWhiteSpace<false>(value_t,escapeQuotes,&local_18);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,__ptr,__ptr + local_18);
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

json_string JSONWorker::RemoveWhiteSpaceAndComments(const json_string & value_t, bool escapeQuotes) json_nothrow {
	json_auto<json_char> s;
    size_t len;
	s.set(PRIVATE_REMOVEWHITESPACE(false, value_t, escapeQuotes, len)); 
	return json_string(s.ptr, len);
}